

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpmOld.c
# Opt level: O0

Gia_Man_t * Abs_RpmPerformOld(Gia_Man_t *p,int fVerbose)

{
  int nFlopsOld_00;
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  Aig_Man_t *p_00;
  Aig_Man_t *p_01;
  int nFlopsOld;
  Gia_Man_t *pTmp;
  Gia_Man_t *pNew;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  nFlopsOld_00 = Gia_ManRegNum(p);
  if (fVerbose != 0) {
    printf("Original AIG:\n");
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  pGVar1 = Gia_ManDupTrimmed(p,1,0,0,-1);
  if (fVerbose != 0) {
    printf("After PI trimming:\n");
    Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
  }
  pGVar2 = Gia_ManDupIn2Ff(pGVar1);
  Gia_ManStop(pGVar1);
  if (fVerbose != 0) {
    printf("After PI-2-FF transformation:\n");
    Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
  }
  p_00 = Gia_ManToAigSimple(pGVar2);
  Gia_ManStop(pGVar2);
  p_01 = Saig_ManRetimeMinArea(p_00,10,0,0,1,0);
  Aig_ManStop(p_00);
  pGVar1 = Gia_ManFromAigSimple(p_01);
  Aig_ManStop(p_01);
  if (fVerbose != 0) {
    printf("After min-area retiming:\n");
    Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
  }
  pGVar2 = Gia_ManDupFf2In(pGVar1,nFlopsOld_00);
  Gia_ManStop(pGVar1);
  if (fVerbose != 0) {
    printf("After FF-2-PI tranformation:\n");
    Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Abs_RpmPerformOld( Gia_Man_t * p, int fVerbose )
{
//    extern Aig_Man_t * Saig_ManRetimeMinArea( Aig_Man_t * p, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose );
    Aig_Man_t * pMan, * pTemp;
    Gia_Man_t * pNew, * pTmp;
    int nFlopsOld = Gia_ManRegNum(p);
    if ( fVerbose )
    {
        printf( "Original AIG:\n" );
        Gia_ManPrintStats( p, NULL );
    }

    // perform input trimming
    pNew = Gia_ManDupTrimmed( p, 1, 0, 0, -1 );
    if ( fVerbose )
    {
        printf( "After PI trimming:\n" );
        Gia_ManPrintStats( pNew, NULL );
    }
    // transform GIA
    pNew = Gia_ManDupIn2Ff( pTmp = pNew );
    Gia_ManStop( pTmp );
    if ( fVerbose )
    {
        printf( "After PI-2-FF transformation:\n" );
        Gia_ManPrintStats( pNew, NULL );
    }

    // derive AIG
    pMan = Gia_ManToAigSimple( pNew );
    Gia_ManStop( pNew );
    // perform min-reg retiming
    pMan = Saig_ManRetimeMinArea( pTemp = pMan, 10, 0, 0, 1, 0 );
    Aig_ManStop( pTemp );
    // derive GIA
    pNew = Gia_ManFromAigSimple( pMan );
    Aig_ManStop( pMan );
    if ( fVerbose )
    {
        printf( "After min-area retiming:\n" );
        Gia_ManPrintStats( pNew, NULL );
    }

    // transform back
    pNew = Gia_ManDupFf2In( pTmp = pNew, nFlopsOld );
    Gia_ManStop( pTmp );
    if ( fVerbose )
    {
        printf( "After FF-2-PI tranformation:\n" );
        Gia_ManPrintStats( pNew, NULL );
    }
    return pNew;
}